

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gls::Functional::anon_unknown_0::ScissorCase::iterate(ScissorCase *this)

{
  ostringstream *poVar1;
  TextureFormat log;
  RenderContext *pRVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ContextType type;
  GLSLVersion version;
  deUint32 dVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar8;
  char *description;
  int iVar9;
  uint uVar10;
  qpTestResult testResult;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  void *pvVar15;
  long lVar16;
  undefined1 auVar17 [16];
  RandomViewport viewport;
  Surface refImage;
  Surface resImage;
  Vec4 threshold;
  ShaderProgram shader;
  RandomViewport local_328;
  Surface local_318;
  Surface local_300;
  Vector<int,_4> local_2e8;
  ConstPixelBufferAccess local_2d8;
  TextureFormat local_2b0;
  IVec4 local_2a8;
  Vec4 local_298;
  undefined1 local_288 [120];
  ios_base local_210 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8 [9];
  ShaderProgram local_100;
  long lVar7;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  log = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar16 = CONCAT44(extraout_var_00,iVar4);
  iVar4 = 8 - *(int *)(lVar16 + 8);
  iVar9 = 8 - *(int *)(lVar16 + 0xc);
  iVar11 = 8 - *(int *)(lVar16 + 0x10);
  iVar8 = 8 - *(int *)(lVar16 + 0x14);
  iVar13 = 0;
  if (iVar4 < 1) {
    iVar4 = iVar13;
  }
  uVar5 = 1 << ((byte)iVar4 & 0x1f);
  if (iVar9 < 1) {
    iVar9 = iVar13;
  }
  uVar14 = 1 << ((byte)iVar9 & 0x1f);
  if (iVar11 < 1) {
    iVar11 = iVar13;
  }
  uVar10 = 1 << ((byte)iVar11 & 0x1f);
  if (iVar8 < 1) {
    iVar8 = iVar13;
  }
  uVar12 = 1 << ((byte)iVar8 & 0x1f);
  auVar17._12_4_ = uVar12;
  auVar17._8_4_ = uVar10;
  auVar17._4_4_ = uVar14;
  auVar17._0_4_ = uVar5;
  auVar17 = _DAT_01a16490 & auVar17 | _DAT_01a57080;
  local_298.m_data[0] =
       (((float)(uVar5 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar17._0_4_) * 0.02;
  local_298.m_data[1] =
       (((float)(uVar14 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar17._4_4_) * 0.02;
  local_298.m_data[2] =
       (((float)(uVar10 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar17._8_4_) * 0.02;
  local_298.m_data[3] =
       (((float)(uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar17._12_4_) * 0.02;
  pRVar2 = this->m_renderCtx;
  type.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])(pRVar2);
  version = glu::getContextTypeGLSLVersion(type);
  genShaders((ProgramSources *)local_288,version);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar2,(ProgramSources *)local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar16 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar16));
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != -0x18);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar6 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  TextureTestUtil::RandomViewport::RandomViewport
            (&local_328,(RenderTarget *)CONCAT44(extraout_var_01,iVar4),0x100,0x100,dVar6);
  local_2a8.m_data[0] = (int)((this->m_scissorArea).m_data[0] * (float)local_328.width);
  local_2a8.m_data[1] = (int)((this->m_scissorArea).m_data[1] * (float)local_328.height);
  local_2e8.m_data[2] = (int)((this->m_scissorArea).m_data[2] * (float)local_328.width);
  local_2e8.m_data[3] = (int)((this->m_scissorArea).m_data[3] * (float)local_328.height);
  local_2e8.m_data[0] = local_328.x + local_2a8.m_data[0];
  local_2e8.m_data[1] = local_328.y + local_2a8.m_data[1];
  local_2a8.m_data[2] = local_2e8.m_data[2];
  local_2a8.m_data[3] = local_2e8.m_data[3];
  tcu::Surface::Surface(&local_318,local_328.width,local_328.height);
  tcu::Surface::Surface(&local_300,local_328.width,local_328.height);
  if (local_100.m_program.m_info.linkOk == false) {
    glu::operator<<((TestLog *)log,&local_100);
    description = "Shader compile/link failed";
    testResult = QP_TEST_RESULT_FAIL;
  }
  else {
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Viewport area is ",0x11);
    tcu::operator<<((ostream *)poVar1,(Vector<int,_4> *)&local_2d8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Scissor area is ",0x10);
    tcu::operator<<((ostream *)poVar1,&local_2e8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Rendering reference (scissors disabled)",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar7 + 0x1680))(local_100.m_program.m_program);
    (**(code **)(lVar7 + 0x1a00))(local_328.x,local_328.y,local_328.width,local_328.height);
    (**(code **)(lVar7 + 0x1c0))(0x3e000000,0x3e800000);
    (**(code **)(lVar7 + 0x1d0))(0x3f800000);
    (**(code **)(lVar7 + 0x208))(0);
    (**(code **)(lVar7 + 0x4e8))(0xb71);
    (**(code **)(lVar7 + 0x4e8))(0xb90);
    (**(code **)(lVar7 + 0x4e8))(0xc11);
    (**(code **)(lVar7 + 0x188))(0x4500);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
              (this,(ulong)local_100.m_program.m_program);
    iVar9 = local_328.y;
    iVar4 = local_328.x;
    pRVar2 = this->m_renderCtx;
    local_2d8.m_format.order = RGBA;
    local_2d8.m_format.type = UNORM_INT8;
    pvVar15 = (void *)local_318.m_pixels.m_cap;
    if ((void *)local_318.m_pixels.m_cap != (void *)0x0) {
      pvVar15 = local_318.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,&local_2d8.m_format,local_318.m_width,
               local_318.m_height,1,pvVar15);
    glu::readPixels(pRVar2,iVar4,iVar9,(PixelBufferAccess *)local_288);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0xf5);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Rendering result (scissors enabled)",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar7 + 0x1680))(local_100.m_program.m_program);
    (**(code **)(lVar7 + 0x1a00))(local_328.x,local_328.y,local_328.width,local_328.height);
    (**(code **)(lVar7 + 0x1c0))(0x3e000000,0x3e800000);
    (**(code **)(lVar7 + 0x1d0))(0x3f800000);
    (**(code **)(lVar7 + 0x208))(0);
    (**(code **)(lVar7 + 0x4e8))(0xb71);
    (**(code **)(lVar7 + 0x4e8))(0xb90);
    (**(code **)(lVar7 + 0x4e8))(0xc11);
    (**(code **)(lVar7 + 0x188))(0x4500);
    (**(code **)(lVar7 + 0x1290))
              (local_2e8.m_data[0],local_2e8.m_data[1],local_2e8.m_data[2],local_2e8.m_data[3]);
    (**(code **)(lVar7 + 0x5e0))(0xc11);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
              (this,(ulong)local_100.m_program.m_program);
    pRVar2 = this->m_renderCtx;
    local_2d8.m_format.order = RGBA;
    local_2d8.m_format.type = UNORM_INT8;
    pvVar15 = (void *)local_300.m_pixels.m_cap;
    if ((void *)local_300.m_pixels.m_cap != (void *)0x0) {
      pvVar15 = local_300.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,&local_2d8.m_format,local_300.m_width,
               local_300.m_height,1,pvVar15);
    glu::readPixels(pRVar2,local_328.x,local_328.y,(PixelBufferAccess *)local_288);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0x10d);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Clearing area outside scissor area from reference",0x31);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    local_2d8.m_format.order = RGBA;
    local_2d8.m_format.type = UNORM_INT8;
    pvVar15 = (void *)local_318.m_pixels.m_cap;
    if ((void *)local_318.m_pixels.m_cap != (void *)0x0) {
      pvVar15 = local_318.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,&local_2d8.m_format,local_318.m_width,
               local_318.m_height,1,pvVar15);
    local_2d8.m_format.order = 0x20;
    local_2d8.m_format.type = 0x40;
    local_2d8.m_size.m_data[0] = 0x80;
    local_2d8.m_size.m_data[1] = 0xff;
    Functional::(anonymous_namespace)::clearEdges<tcu::Vector<int,4>>
              ((PixelBufferAccess *)local_288,(Vector<int,_4> *)&local_2d8,&local_2a8);
    local_2d8.m_format.order = RGBA;
    local_2d8.m_format.type = UNORM_INT8;
    if ((void *)local_318.m_pixels.m_cap != (void *)0x0) {
      local_318.m_pixels.m_cap = (size_t)local_318.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,&local_2d8.m_format,local_318.m_width,
               local_318.m_height,1,(void *)local_318.m_pixels.m_cap);
    local_2b0.order = RGBA;
    local_2b0.type = UNORM_INT8;
    if ((void *)local_300.m_pixels.m_cap != (void *)0x0) {
      local_300.m_pixels.m_cap = (size_t)local_300.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_2d8,&local_2b0,local_300.m_width,local_300.m_height,1,
               (void *)local_300.m_pixels.m_cap);
    bVar3 = tcu::floatThresholdCompare
                      ((TestLog *)log,"ComparisonResult","Image comparison result",
                       (ConstPixelBufferAccess *)local_288,&local_2d8,&local_298,COMPARE_LOG_RESULT)
    ;
    testResult = (qpTestResult)!bVar3;
    description = "Image comparison failed";
    if (bVar3) {
      description = "Pass";
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,testResult,description);
  tcu::Surface::~Surface(&local_300);
  tcu::Surface::~Surface(&local_318);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return STOP;
}

Assistant:

ScissorCase::IterateResult ScissorCase::iterate (void)
{
	using TextureTestUtil::RandomViewport;

	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	TestLog&					log				= m_testCtx.getLog();
	const tcu::PixelFormat		renderFormat	= m_renderCtx.getRenderTarget().getPixelFormat();
	const tcu::Vec4				threshold		= 0.02f * UVec4(1u << de::max(0, 8 - renderFormat.redBits),
																1u << de::max(0, 8 - renderFormat.greenBits),
																1u << de::max(0, 8 - renderFormat.blueBits),
																1u << de::max(0, 8 - renderFormat.alphaBits)).asFloat();
	const glu::ShaderProgram	shader			(m_renderCtx, genShaders(glu::getContextTypeGLSLVersion(m_renderCtx.getType())));

	const RandomViewport		viewport		(m_renderCtx.getRenderTarget(), 256, 256, deStringHash(getName()));
	const IVec4					relScissorArea	(int(m_scissorArea.x() * (float)viewport.width),
												 int(m_scissorArea.y() * (float)viewport.height),
												 int(m_scissorArea.z() * (float)viewport.width),
												 int(m_scissorArea.w() * (float)viewport.height));
	const IVec4					absScissorArea	(relScissorArea.x() + viewport.x,
												 relScissorArea.y() + viewport.y,
												 relScissorArea.z(),
												 relScissorArea.w());

	tcu::Surface				refImage		(viewport.width, viewport.height);
	tcu::Surface				resImage		(viewport.width, viewport.height);

	if (!shader.isOk())
	{
		log << shader;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader compile/link failed");
		return STOP;
	}

	log << TestLog::Message << "Viewport area is " << IVec4(viewport.x, viewport.y, viewport.width, viewport.height) << TestLog::EndMessage;
	log << TestLog::Message << "Scissor area is " << absScissorArea << TestLog::EndMessage;

	// Render reference (no scissors)
	{
		log << TestLog::Message << "Rendering reference (scissors disabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

		gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
		gl.clearDepthf(1.0f);
		gl.clearStencil(0);
		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

		render(shader.getProgram(), IVec4(viewport.x, viewport.y, viewport.width, viewport.height));

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, refImage.getAccess());
		GLU_CHECK_ERROR(gl.getError());
	}

	// Render result (scissors)
	{
		log << TestLog::Message << "Rendering result (scissors enabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

		gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
		gl.clearDepthf(1.0f);
		gl.clearStencil(0);
		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

		gl.scissor(absScissorArea.x(), absScissorArea.y(), absScissorArea.z(), absScissorArea.w());
		gl.enable(GL_SCISSOR_TEST);

		render(shader.getProgram(), IVec4(viewport.x, viewport.y, viewport.width, viewport.height));

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, resImage.getAccess());
		GLU_CHECK_ERROR(gl.getError());
	}

	// Manual 'scissors' for reference image
	log << TestLog::Message << "Clearing area outside scissor area from reference" << TestLog::EndMessage;
	clearEdges(refImage.getAccess(), IVec4(32, 64, 128, 255), relScissorArea);

	if (tcu::floatThresholdCompare(log, "ComparisonResult", "Image comparison result", refImage.getAccess(), resImage.getAccess(), threshold, tcu::COMPARE_LOG_RESULT))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	return STOP;
}